

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O3

uint32_t __thiscall
ICACHE::ic_simulate_fetch(ICACHE *this,oraddr_t fetchaddr,oraddr_t virt_addr,int insn_ci)

{
  uint uVar1;
  CPU *pCVar2;
  uint *puVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  BUS_DEVICE *pBVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pCVar2 = (this->super_CACHE).cpu;
  if ((((pCVar2->sprs[1] & 4) != 0) && (insn_ci == 0)) && ((pCVar2->sprs[0x11] & 0x10) != 0)) {
    uVar5 = ((this->super_CACHE).set_mask & fetchaddr) >>
            ((byte)(this->super_CACHE).blocksize_log2 & 0x1f);
    uVar9 = (this->super_CACHE).tagaddr_mask & fetchaddr;
    uVar10 = (this->super_CACHE).last_way;
    uVar13 = uVar5;
    if (uVar5 < uVar10) {
      uVar12 = (this->super_CACHE).nsets;
      uVar11 = uVar5;
      do {
        if ((this->super_CACHE).tags[uVar11] == uVar9) {
          puVar3 = (this->super_CACHE).lrus;
          do {
            if (puVar3[uVar11] < puVar3[uVar5]) {
              puVar3[uVar5] = puVar3[uVar5] - 1;
              uVar12 = (this->super_CACHE).nsets;
              uVar10 = (this->super_CACHE).last_way;
            }
            uVar5 = uVar5 + uVar12;
          } while (uVar5 < uVar10);
          puVar3[uVar11] = (this->super_CACHE).ustates_reload;
          return *(uint32_t *)
                  ((this->super_CACHE).mem +
                  (fetchaddr & (this->super_CACHE).block_offset_mask |
                  uVar11 << ((byte)(this->super_CACHE).blocksize_log2 & 0x1f)));
        }
        uVar11 = uVar11 + uVar12;
      } while (uVar11 < uVar10);
      if (uVar5 < uVar10) {
        uVar12 = (this->super_CACHE).ustates_reload;
        uVar11 = uVar5;
        do {
          uVar1 = (this->super_CACHE).lrus[uVar11];
          if (uVar1 < uVar12) {
            uVar12 = uVar1;
            uVar13 = uVar11;
          }
          uVar11 = uVar11 + (this->super_CACHE).nsets;
        } while (uVar11 < uVar10);
      }
    }
    (this->super_CACHE).tags[uVar13] = uVar9;
    uVar10 = (this->super_CACHE).last_way;
    puVar3 = (this->super_CACHE).lrus;
    for (; uVar5 < uVar10; uVar5 = uVar5 + (this->super_CACHE).nsets) {
      if (puVar3[uVar5] != 0) {
        puVar3[uVar5] = puVar3[uVar5] - 1;
        uVar10 = (this->super_CACHE).last_way;
      }
    }
    puVar3[uVar13] = (this->super_CACHE).ustates_reload;
    uVar10 = (this->super_CACHE).block_offset_mask;
    uVar5 = uVar10 & fetchaddr;
    uVar9 = (this->super_CACHE).blocksize + uVar5;
    uVar13 = uVar13 << ((byte)(this->super_CACHE).blocksize_log2 & 0x1f);
    if (uVar5 < uVar9) {
      uVar10 = fetchaddr & (this->super_CACHE).block_mask;
      do {
        pBVar7 = BUS::get_device((this->super_CACHE).bus_p,
                                 (this->super_CACHE).block_offset_mask & uVar5 | uVar10);
        iVar6 = (*pBVar7->_vptr_BUS_DEVICE[2])
                          (pBVar7,(ulong)((this->super_CACHE).block_offset_mask & uVar5 | uVar10),0)
        ;
        puVar8 = (this->super_CACHE).mem;
        *(int *)(puVar8 + ((this->super_CACHE).block_offset_mask & uVar5 | uVar13)) = iVar6;
        uVar5 = uVar5 + 4;
      } while (uVar5 < uVar9);
      uVar10 = (this->super_CACHE).block_offset_mask;
    }
    else {
      puVar8 = (this->super_CACHE).mem;
    }
    return *(uint32_t *)(puVar8 + (uVar10 & uVar5 | uVar13));
  }
  pBVar7 = BUS::get_device((this->super_CACHE).bus_p,fetchaddr);
  uVar4 = (*pBVar7->_vptr_BUS_DEVICE[2])
                    (pBVar7,fetchaddr,(ulong)virt_addr,pBVar7->_vptr_BUS_DEVICE[2]);
  return uVar4;
}

Assistant:

uint32_t ICACHE::ic_simulate_fetch(oraddr_t fetchaddr, oraddr_t virt_addr, int insn_ci)
{
    oraddr_t set;
    oraddr_t way;
    oraddr_t lru_way;
    oraddr_t tagaddr;
    uint32_t tmp;
    oraddr_t reload_addr;
    oraddr_t reload_end;
    unsigned int minlru;

    /* ICache simulation enabled/disabled. */
    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_ICP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_ICE) || insn_ci)
    {
        BUS_DEVICE * device = bus_p->get_device(fetchaddr);
        tmp = device->Read32(fetchaddr, virt_addr);
        // if (cur_area && cur_area->log)
        //     fprintf(cur_area->log, "[%" PRIxADDR "] -> read %08" PRIx32 "\n",
        //             fetchaddr, tmp);
        return tmp;
    }

    /* Which set to check out? */
    set = (fetchaddr & set_mask) >> blocksize_log2;
    tagaddr = fetchaddr & tagaddr_mask;

    /* Scan all ways and try to find a matching way. */
    for (way = set; way < last_way; way += nsets)
    {
        if (tags[way] == tagaddr)
        {
            // ic_stats.readhit++;

            for (lru_way = set; lru_way < last_way; lru_way += nsets)
                if (lrus[lru_way] > lrus[way])
                    lrus[lru_way]--;
            lrus[way] = ustates_reload;
            // runtime.sim.mem_cycles += ic->hitdelay;
            way <<= blocksize_log2;
            return *(uint32_t *)&mem[way | (fetchaddr & block_offset_mask)];
        }
    }

    minlru = ustates_reload;
    way = set;

    // ic_stats.readmiss++;

    for (lru_way = set; lru_way < last_way; lru_way += nsets)
    {
        if (lrus[lru_way] < minlru)
        {
            way = lru_way;
            minlru = lrus[lru_way];
        }
    }

    tags[way] = tagaddr;
    for (lru_way = set; lru_way < last_way; lru_way += nsets)
        if (lrus[lru_way])
            lrus[lru_way]--;
    lrus[way] = ustates_reload;

    reload_addr = fetchaddr & block_offset_mask;
    reload_end = reload_addr + blocksize;

    fetchaddr &= block_mask;

    way <<= blocksize_log2;
    for (; reload_addr < reload_end; reload_addr += 4)
    {
        BUS_DEVICE * device = bus_p->get_device(fetchaddr | (reload_addr & block_offset_mask));
        tmp = *(uint32_t *)&mem[way | (reload_addr & block_offset_mask)]
            = device->Read32(fetchaddr | (reload_addr & block_offset_mask), 0);

        // if (!cur_area)
        // {
        //     tags[way >> blocksize_log2] = -1;
        //     lrus[way >> blocksize_log2] = 0;
        //     return 0;
        // }
        // else if (cur_area->log)
        //     fprintf(cur_area->log, "[%" PRIxADDR "] -> read %08" PRIx32 "\n",
        //             fetchaddr, tmp);
    }

    // runtime.sim.mem_cycles += missdelay;

    // if (config.pcu.enabled)
    //     pcu_count_event(SPR_PCMR_ICM);

    return *(uint32_t *)&mem[way | (reload_addr & block_offset_mask)];
}